

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O1

UpdateType __thiscall
libDAI::Properties::FromStringTo<libDAI::JTree::UpdateType>(Properties *this,PropertyKey *key)

{
  char *__s1;
  int iVar1;
  const_iterator cVar2;
  long *plVar3;
  undefined *puVar4;
  UpdateType result;
  stringstream ss;
  UpdateType local_1c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  if (*(long **)(cVar2._M_node + 2) == (long *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)(**(code **)(**(long **)(cVar2._M_node + 2) + 0x18))();
  }
  if (plVar3 == (long *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    puVar4 = (undefined *)(**(code **)(*plVar3 + 0x10))(plVar3);
  }
  __s1 = *(char **)(puVar4 + 8);
  if (__s1 == "N6libDAI5JTree10UpdateTypeE") {
LAB_004bdbec:
    local_1c4 = GetAs<libDAI::JTree::UpdateType>(this,key);
  }
  else {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N6libDAI5JTree10UpdateTypeE");
      if (iVar1 == 0) goto LAB_004bdbec;
    }
    std::__cxx11::stringstream::stringstream(local_1a0);
    GetAs<std::__cxx11::string>(&local_1c0,this,key);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    local_1c4.v = HUGIN;
    operator>>((istream *)local_1a0,&local_1c4);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  return (UpdateType)local_1c4.v;
}

Assistant:

ValueType FromStringTo(const PropertyKey &key) const { 
                PropertyValue val = Get(key);
                if( val.type() != typeid(ValueType) ) {
                    assert( val.type() == typeid(std::string) );

                    std::stringstream ss;
                    ss << GetAs<std::string>(key);
                    ValueType result;
                    ss >> result;

                    return result;
                } else
                    return GetAs<ValueType>(key);
            }